

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:68:21)>
::getImpl(SimpleTransformPromiseNode<unsigned_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:68:21)>
          *this,ExceptionOrValue *output)

{
  Network *pNVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>_2
  local_360;
  ExceptionOr<unsigned_int> depResult;
  ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> local_1b8;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1b8,
               &depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_1b8.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *)output,
               &local_1b8);
    ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::~ExceptionOr
              (&local_1b8);
  }
  else if (depResult.value.ptr.isSet == true) {
    pNVar1 = (this->func).network;
    (**pNVar1->_vptr_Network)
              (&local_360,pNVar1,"localhost",10,(ulong)depResult.value.ptr.field_1.value);
    local_1b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b8.value.ptr.isSet = true;
    local_1b8.value.ptr.field_1 = local_360;
    local_360 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>_2
                 )0x0;
    ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> *)output,
               &local_1b8);
    ExceptionOr<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::~ExceptionOr
              (&local_1b8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_360.value);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&depResult);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }